

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateVkImpl::InitializePipeline
          (PipelineStateVkImpl *this,GraphicsPipelineStateCreateInfo *CreateInfo)

{
  PRIMITIVE_TOPOLOGY PrimTopology;
  IPipelineStateCache *pSrcPtr;
  RenderDeviceVkImpl *pRVar1;
  GraphicsPipelineData *PipelineDesc;
  VulkanPhysicalDevice *pVVar2;
  VulkanLogicalDevice *this_00;
  RenderPassCache *this_01;
  VkPipelineVertexInputDivisorStateCreateInfoEXT *pVVar3;
  int iVar4;
  RefCntAutoPtr<Diligent::IRenderPass> *this_02;
  RenderPassVkImpl *pObj;
  undefined4 extraout_var;
  IRenderPassVk *pIVar5;
  undefined4 extraout_var_00;
  char (*Args_1) [97];
  uint uVar6;
  initializer_list<VkDynamicState> __l;
  allocator_type local_629;
  VkPipelineCache local_628;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> DynamicStates;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  vkShaderStages;
  vector<VkFormat,_std::allocator<VkFormat>_> ColorAttachmentFormats;
  PipelineWrapper local_5c0;
  VkPipelineRenderingCreateInfoKHR PipelineRenderingCI;
  VkPipelineInputAssemblyStateCreateInfo local_578;
  vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ColorBlendAttachmentStates;
  VkPipelineViewportStateCreateInfo local_538;
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ShaderModules;
  VkPipelineDynamicStateCreateInfo local_4e8;
  VkRect2D local_4c8;
  VkGraphicsPipelineCreateInfo local_4b0;
  uint32_t SampleMask [2];
  VkPipelineColorBlendStateCreateInfo BlendStateCI;
  VkPipelineTessellationStateCreateInfo local_3d8;
  TShaderStages local_3c0;
  VkPipelineVertexInputDivisorStateCreateInfoEXT VertexInputDivisorCI;
  VkPipelineDepthStencilStateCreateInfo DepthStencilStateCI;
  VkPipelineVertexInputStateCreateInfo VertexInputStateCI;
  array<VkVertexInputAttributeDescription,_16UL> AttributeDescription;
  VkPipelineMultisampleStateCreateInfo local_1e0;
  VkPipelineRasterizationStateCreateInfo RasterizerStateCI;
  array<VkVertexInputBindingDivisorDescription,_16UL> VertexBindingDivisors;
  array<VkVertexInputBindingDescription,_16UL> BindingDescriptions;
  
  vkShaderStages.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vkShaderStages.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vkShaderStages.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShaderModules.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ShaderModules.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ShaderModules.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  InitInternalObjects<Diligent::GraphicsPipelineStateCreateInfo>
            (&local_3c0,this,CreateInfo,&vkShaderStages,&ShaderModules);
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::~vector(&local_3c0);
  pSrcPtr = (CreateInfo->super_PipelineStateCreateInfo).pPSOCache;
  if (pSrcPtr == (IPipelineStateCache *)0x0) {
    local_628 = (VkPipelineCache)0x0;
  }
  else {
    CheckDynamicType<Diligent::PipelineStateCacheVkImpl,Diligent::IPipelineStateCache>(pSrcPtr);
    local_628 = (VkPipelineCache)pSrcPtr[9].super_IDeviceObject.super_IObject._vptr_IObject;
  }
  pRVar1 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           .m_pDevice;
  PipelineDesc = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).field_6.
                 m_pGraphicsPipelineData;
  this_02 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetRenderPassPtr
                      (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  pVVar2 = (pRVar1->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  this_00 = (pRVar1->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  memset(&local_4b0,0,0x90);
  local_4b0.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_4b0.flags = 1;
  PipelineRenderingCI.depthAttachmentFormat = VK_FORMAT_UNDEFINED;
  PipelineRenderingCI.stencilAttachmentFormat = VK_FORMAT_UNDEFINED;
  PipelineRenderingCI.viewMask = 0;
  PipelineRenderingCI.colorAttachmentCount = 0;
  PipelineRenderingCI.pColorAttachmentFormats = (VkFormat *)0x0;
  ColorAttachmentFormats.super__Vector_base<VkFormat,_std::allocator<VkFormat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PipelineRenderingCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  PipelineRenderingCI._4_4_ = 0;
  PipelineRenderingCI.pNext = (void *)0x0;
  ColorAttachmentFormats.super__Vector_base<VkFormat,_std::allocator<VkFormat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ColorAttachmentFormats.super__Vector_base<VkFormat,_std::allocator<VkFormat>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this_02->m_pObject == (IRenderPass *)0x0) {
    this_01 = (pRVar1->m_ImplicitRenderPassCache)._M_t.
              super___uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
              ._M_t.
              super__Tuple_impl<0UL,_Diligent::RenderPassCache_*,_std::default_delete<Diligent::RenderPassCache>_>
              .super__Head_base<0UL,_Diligent::RenderPassCache_*,_false>._M_head_impl;
    if (this_01 == (RenderPassCache *)0x0) {
      GraphicsPipelineDesc_To_VkPipelineRenderingCreateInfo
                ((VkPipelineRenderingCreateInfoKHR *)&AttributeDescription,&PipelineDesc->Desc,
                 &ColorAttachmentFormats);
      PipelineRenderingCI.depthAttachmentFormat = AttributeDescription._M_elems[2].location;
      PipelineRenderingCI.stencilAttachmentFormat = AttributeDescription._M_elems[2].binding;
      PipelineRenderingCI.viewMask = AttributeDescription._M_elems[1].location;
      PipelineRenderingCI.colorAttachmentCount = AttributeDescription._M_elems[1].binding;
      PipelineRenderingCI.pColorAttachmentFormats =
           (VkFormat *)AttributeDescription._M_elems[1]._8_8_;
      PipelineRenderingCI.sType = AttributeDescription._M_elems[0].location;
      PipelineRenderingCI._4_4_ = AttributeDescription._M_elems[0].binding;
      PipelineRenderingCI.pNext = (void *)AttributeDescription._M_elems[0]._8_8_;
      if (((PipelineDesc->Desc).ShadingRateFlags & PIPELINE_SHADING_RATE_FLAG_LAST) !=
          PIPELINE_SHADING_RATE_FLAG_NONE) {
        local_4b0.flags = 0x200001;
      }
    }
    else {
      RenderPassCache::RenderPassCacheKey::RenderPassCacheKey
                ((RenderPassCacheKey *)&AttributeDescription,
                 (uint)(PipelineDesc->Desc).NumRenderTargets,
                 (uint)(PipelineDesc->Desc).SmplDesc.Count,(PipelineDesc->Desc).RTVFormats,
                 (PipelineDesc->Desc).DSVFormat,
                 (bool)(((PipelineDesc->Desc).ShadingRateFlags & PIPELINE_SHADING_RATE_FLAG_LAST) >>
                       1),(PipelineDesc->Desc).ReadOnlyDSV);
      pObj = RenderPassCache::GetRenderPass(this_01,(RenderPassCacheKey *)&AttributeDescription);
      RefCntAutoPtr<Diligent::IRenderPass>::operator=(this_02,(IRenderPass *)pObj);
      if (this_02->m_pObject == (IRenderPass *)0x0) {
        LogError<true,char[38]>
                  (false,"CreateGraphicsPipeline",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0xa3,(char (*) [38])"Failed to create default render pass.");
      }
    }
  }
  local_4b0.stageCount =
       (uint32_t)
       (((long)vkShaderStages.
               super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)vkShaderStages.
              super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  local_4b0.pStages =
       vkShaderStages.
       super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4b0.layout = (this->m_PipelineLayout).m_VkPipelineLayout.m_VkObject;
  VertexInputStateCI.vertexAttributeDescriptionCount = 0;
  VertexInputStateCI._36_4_ = 0;
  VertexInputStateCI.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  VertexInputStateCI.flags = 0;
  VertexInputStateCI.vertexBindingDescriptionCount = 0;
  VertexInputStateCI.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  VertexInputStateCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  VertexInputStateCI._4_4_ = 0;
  VertexInputStateCI.pNext = (void *)0x0;
  VertexInputDivisorCI.vertexBindingDivisorCount = 0;
  VertexInputDivisorCI._20_4_ = 0;
  VertexInputDivisorCI.pVertexBindingDivisors = (VkVertexInputBindingDivisorDescription *)0x0;
  VertexInputDivisorCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  VertexInputDivisorCI._4_4_ = 0;
  VertexInputDivisorCI.pNext = (void *)0x0;
  InputLayoutDesc_To_VkVertexInputStateCI
            (&(PipelineDesc->Desc).InputLayout,&VertexInputStateCI,&VertexInputDivisorCI,
             &BindingDescriptions,&AttributeDescription,&VertexBindingDivisors);
  local_4b0.pVertexInputState = &VertexInputStateCI;
  pVVar3 = (VkPipelineVertexInputDivisorStateCreateInfoEXT *)VertexInputStateCI.pNext;
  if ((VertexInputDivisorCI.vertexBindingDivisorCount != 0) &&
     (pVVar3 = &VertexInputDivisorCI,
     (pRVar1->
     super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
     ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.
     InstanceDataStepRate == DEVICE_FEATURE_STATE_DISABLED)) {
    FormatString<char[51]>
              ((string *)&DepthStencilStateCI,
               (char (*) [51])"InstanceDataStepRate device feature is not enabled");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,DepthStencilStateCI._0_8_,0,0,0);
    }
    std::__cxx11::string::~string((string *)&DepthStencilStateCI);
  }
  VertexInputStateCI.pNext = pVVar3;
  local_578.pNext = (void *)0x0;
  local_578.flags = 0;
  local_578.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_578.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_578._4_4_ = 0;
  PrimTopology = (PipelineDesc->Desc).PrimitiveTopology;
  if ((PrimTopology < 8) && ((0xa4U >> (PrimTopology & 0x1f) & 1) != 0)) {
    local_578.primitiveRestartEnable = 1;
  }
  else {
    local_578.primitiveRestartEnable = (VkBool32)(PrimTopology == PRIMITIVE_TOPOLOGY_LINE_STRIP_ADJ)
    ;
  }
  local_4b0.pInputAssemblyState = &local_578;
  local_578._28_4_ = 0;
  local_4b0.pTessellationState = &local_3d8;
  local_3d8.pNext = (void *)0x0;
  local_3d8.flags = 0;
  local_3d8.patchControlPoints = 0;
  local_3d8.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_3d8._4_4_ = 0;
  if ((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
      .m_Desc.PipelineType == PIPELINE_TYPE_MESH) {
    local_578.flags = 0;
    local_578.topology = VK_PRIMITIVE_TOPOLOGY_MAX_ENUM;
    local_4b0.pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  else {
    PrimitiveTopology_To_VkPrimitiveTopologyAndPatchCPCount
              (PrimTopology,&local_578.topology,&local_3d8.patchControlPoints);
  }
  local_538.pNext = (void *)0x0;
  local_538.pViewports = (VkViewport *)0x0;
  local_538.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_538._4_4_ = 0;
  local_538.scissorCount._0_1_ = (PipelineDesc->Desc).NumViewports;
  local_538._16_8_ = (ulong)(byte)local_538.scissorCount << 0x20;
  local_538._33_7_ = 0;
  local_4c8.offset.x = 0;
  local_4c8.offset.y = 0;
  local_4c8.extent.width = 0;
  local_4c8.extent.height = 0;
  if ((PipelineDesc->Desc).RasterizerDesc.ScissorEnable == false) {
    local_4c8.extent.width = (pVVar2->m_Properties).limits.maxViewportDimensions[0];
    local_4c8.extent.height = (pVVar2->m_Properties).limits.maxViewportDimensions[1];
    local_538.pScissors = &local_4c8;
  }
  else {
    local_538.pScissors = (VkRect2D *)0x0;
  }
  local_4b0.pViewportState = &local_538;
  RasterizerStateDesc_To_VkRasterizationStateCI
            (&RasterizerStateCI,&(PipelineDesc->Desc).RasterizerDesc);
  local_4b0.pMultisampleState = &local_1e0;
  local_1e0.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_1e0._4_4_ = 0;
  local_1e0.pNext = (void *)0x0;
  local_1e0.flags = 0;
  local_1e0.rasterizationSamples = (VkSampleCountFlagBits)(PipelineDesc->Desc).SmplDesc.Count;
  local_1e0.sampleShadingEnable = 0;
  local_1e0.minSampleShading = 0.0;
  SampleMask[0] = (PipelineDesc->Desc).SampleMask;
  local_1e0.pSampleMask = SampleMask;
  SampleMask[1] = 0;
  local_1e0.alphaToCoverageEnable = 0;
  local_1e0.alphaToOneEnable = 0;
  local_4b0.pRasterizationState = &RasterizerStateCI;
  DepthStencilStateDesc_To_VkDepthStencilStateCI
            (&DepthStencilStateCI,&(PipelineDesc->Desc).DepthStencilDesc);
  local_4b0.pDepthStencilState = &DepthStencilStateCI;
  if (this_02->m_pObject == (IRenderPass *)0x0) {
    uVar6 = PipelineRenderingCI.colorAttachmentCount;
  }
  else {
    iVar4 = (*(this_02->m_pObject->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    Args_1 = (char (*) [97])((ulong)(PipelineDesc->Desc).SubpassIndex * 0x48);
    uVar6 = *(uint *)(*Args_1 + *(long *)(CONCAT44(extraout_var,iVar4) + 0x20) + 0x10);
    if (((PipelineDesc->Desc).pRenderPass == (IRenderPass *)0x0) &&
       (uVar6 != (PipelineDesc->Desc).NumRenderTargets)) {
      FormatString<char[26],char[97]>
                ((string *)&BlendStateCI,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "GraphicsPipeline.pRenderPass != nullptr || GraphicsPipeline.NumRenderTargets == NumRTAttachments"
                 ,Args_1);
      DebugAssertionFailed
                ((Char *)BlendStateCI._0_8_,"CreateGraphicsPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x123);
      std::__cxx11::string::~string((string *)&BlendStateCI);
    }
  }
  std::
  vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ::vector(&ColorBlendAttachmentStates,(ulong)uVar6,(allocator_type *)&BlendStateCI);
  local_4b0.pColorBlendState = &BlendStateCI;
  BlendStateCI.blendConstants[0] = 0.0;
  BlendStateCI.blendConstants[1] = 0.0;
  BlendStateCI.flags = 0;
  BlendStateCI.logicOpEnable = 0;
  BlendStateCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  BlendStateCI._4_4_ = 0;
  BlendStateCI.pNext = (void *)0x0;
  BlendStateCI.blendConstants[2] = 0.0;
  BlendStateCI.blendConstants[3] = 0.0;
  BlendStateCI.pAttachments = (pointer)0x0;
  if (ColorBlendAttachmentStates.
      super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      ColorBlendAttachmentStates.
      super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    BlendStateCI.pAttachments =
         ColorBlendAttachmentStates.
         super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  BlendStateCI._24_8_ = (ulong)uVar6 << 0x20;
  BlendStateDesc_To_VkBlendStateCI
            ((BlendStateDesc *)PipelineDesc,local_4b0.pColorBlendState,&ColorBlendAttachmentStates);
  local_4e8.pNext = (void *)0x0;
  local_4e8.flags = 0;
  local_4e8.dynamicStateCount = 0;
  local_4e8.pDynamicStates = (VkDynamicState *)0x0;
  local_4e8.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_4e8._4_4_ = 0;
  local_5c0.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x400000000;
  local_5c0.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 8;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_5c0;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            (&DynamicStates,__l,&local_629);
  if ((PipelineDesc->Desc).RasterizerDesc.ScissorEnable == true) {
    local_5c0.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             CONCAT44(local_5c0.m_pLogicalDevice.
                      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._4_4_,1);
    std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::emplace_back<VkDynamicState>
              (&DynamicStates,(VkDynamicState *)&local_5c0);
  }
  if (((PipelineDesc->Desc).ShadingRateFlags != PIPELINE_SHADING_RATE_FLAG_NONE) &&
     ((((pRVar1->m_LogicalVkDevice).
        super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate != 0)) {
    local_5c0.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             CONCAT44(local_5c0.m_pLogicalDevice.
                      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._4_4_,0x3b9e3cd0);
    std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::emplace_back<VkDynamicState>
              (&DynamicStates,(VkDynamicState *)&local_5c0);
  }
  local_4b0.pDynamicState = &local_4e8;
  local_4e8.dynamicStateCount =
       (uint32_t)
       ((ulong)((long)DynamicStates.
                      super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)DynamicStates.
                     super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 2);
  local_4e8.pDynamicStates =
       DynamicStates.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (this_02->m_pObject == (IRenderPass *)0x0) {
    local_4b0.pNext = &PipelineRenderingCI;
  }
  else {
    pIVar5 = RefCntAutoPtr<Diligent::IRenderPass>::RawPtr<Diligent::IRenderPassVk>(this_02);
    iVar4 = (*(pIVar5->super_IRenderPass).super_IDeviceObject.super_IObject._vptr_IObject[8])
                      (pIVar5);
    local_4b0.renderPass = (VkRenderPass)CONCAT44(extraout_var_00,iVar4);
  }
  local_4b0.subpass = (uint32_t)(PipelineDesc->Desc).SubpassIndex;
  local_4b0.basePipelineHandle = (VkPipeline)0x0;
  local_4b0.basePipelineIndex = -1;
  VulkanUtilities::VulkanLogicalDevice::CreateGraphicsPipeline
            (&local_5c0,this_00,&local_4b0,local_628,
             (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  operator=(&this->m_Pipeline,&local_5c0);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  ~VulkanObjectWrapper(&local_5c0);
  std::_Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>::~_Vector_base
            (&DynamicStates.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>);
  std::
  _Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ::~_Vector_base(&ColorBlendAttachmentStates.
                   super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                 );
  std::_Vector_base<VkFormat,_std::allocator<VkFormat>_>::~_Vector_base
            (&ColorAttachmentFormats.super__Vector_base<VkFormat,_std::allocator<VkFormat>_>);
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ::~vector(&ShaderModules);
  std::
  _Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  ~_Vector_base(&vkShaderStages.
                 super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               );
  return;
}

Assistant:

void PipelineStateVkImpl::InitializePipeline(const GraphicsPipelineStateCreateInfo& CreateInfo)
{
    std::vector<VkPipelineShaderStageCreateInfo>      vkShaderStages;
    std::vector<VulkanUtilities::ShaderModuleWrapper> ShaderModules;

    InitInternalObjects(CreateInfo, vkShaderStages, ShaderModules);

    const VkPipelineCache vkSPOCache = CreateInfo.pPSOCache != nullptr ? ClassPtrCast<PipelineStateCacheVkImpl>(CreateInfo.pPSOCache)->GetVkPipelineCache() : VK_NULL_HANDLE;
    CreateGraphicsPipeline(m_pDevice, vkShaderStages, m_PipelineLayout, m_Desc, m_pGraphicsPipelineData->Desc, m_Pipeline, GetRenderPassPtr(), vkSPOCache);
}